

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.h
# Opt level: O2

char * cmTargetPropertyComputer::GetProperty<cmTarget>
                 (cmTarget *tgt,string *prop,cmMessenger *messenger,cmListFileBacktrace *context)

{
  bool bVar1;
  char *pcVar2;
  
  pcVar2 = GetLocation<cmTarget>(tgt,prop,messenger,context);
  if (pcVar2 == (char *)0x0) {
    bVar1 = cmSystemTools::GetFatalErrorOccured();
    if (!bVar1) {
      bVar1 = std::operator==(prop,"SOURCES");
      if (bVar1) {
        pcVar2 = GetSources<cmTarget>(tgt,messenger,context);
        return pcVar2;
      }
    }
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

static const char* GetProperty(Target const* tgt, const std::string& prop,
                                 cmMessenger* messenger,
                                 cmListFileBacktrace const& context)
  {
    if (const char* loc = GetLocation(tgt, prop, messenger, context)) {
      return loc;
    }
    if (cmSystemTools::GetFatalErrorOccured()) {
      return nullptr;
    }
    if (prop == "SOURCES") {
      return GetSources(tgt, messenger, context);
    }
    return nullptr;
  }